

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rain-risk.cpp
# Opt level: O2

ostream * operator<<(ostream *os,ship *s)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  int iVar4;
  
  iVar4 = (s->loc).first;
  iVar1 = (s->loc).second;
  poVar3 = std::operator<<(os,"Coord (");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar4);
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar1);
  poVar3 = std::operator<<(poVar3,"), Dir ");
  poVar3 = std::operator<<(poVar3,s->dir);
  poVar3 = std::operator<<(poVar3,", Manhattan: ");
  iVar4 = (s->loc).first;
  iVar1 = (s->loc).second;
  iVar2 = -iVar4;
  if (0 < iVar4) {
    iVar2 = iVar4;
  }
  iVar4 = -iVar1;
  if (0 < iVar1) {
    iVar4 = iVar1;
  }
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar4 + iVar2);
  poVar3 = std::operator<<(poVar3,", Waypoint (");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(s->waypoint).first);
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(s->waypoint).second);
  std::operator<<(poVar3,")");
  return os;
}

Assistant:

std::ostream& operator<< (std::ostream& os, const ship& s) {
  auto x = s.loc.first, y = s.loc.second;
  os << "Coord (" << x << "," << y << "), "
        "Dir " << static_cast<char>(s.dir) << ", "
        "Manhattan: " << s.manhattan() << ", "
        "Waypoint (" << s.waypoint.first << "," << s.waypoint.second << ")";
  return os;
}